

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

void __thiscall kj::_::BTreeImpl::reserve(BTreeImpl *this,size_t size)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  size_t newSize;
  uint height;
  uint parents;
  uint branchingFactor;
  uint leaves;
  Fault local_58;
  Fault f;
  unsigned_long *local_48;
  undefined1 local_40 [8];
  DebugComparison<unsigned_long_&,_unsigned_int> _kjCondition;
  size_t size_local;
  BTreeImpl *this_local;
  
  _kjCondition._32_8_ = size;
  local_48 = (unsigned_long *)
             DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&_::MAGIC_ASSERT,
                        (unsigned_long *)&_kjCondition.result);
  f.exception._4_4_ = 0x80000000;
  DebugExpression<unsigned_long&>::operator<
            ((DebugComparison<unsigned_long_&,_unsigned_int> *)local_40,
             (DebugExpression<unsigned_long&> *)&local_48,(uint *)((long)&f.exception + 4));
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (!bVar2) {
    Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_int>&,char_const(&)[32]>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
               ,0xdc,FAILED,"size < (1u << 31)","_kjCondition,\"b-tree has reached maximum size\"",
               (DebugComparison<unsigned_long_&,_unsigned_int> *)local_40,
               (char (*) [32])"b-tree has reached maximum size");
    Debug::Fault::fatal(&local_58);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = _kjCondition._32_8_;
  uVar3 = SUB164(auVar1 / ZEXT816(7),0);
  uVar4 = lg(uVar3 | 1);
  uVar5 = lg(4);
  uVar4 = uVar3 + uVar3 / 3 + uVar4 / uVar5 + 4;
  if (this->treeCapacity < uVar4) {
    growTree(this,uVar4);
  }
  return;
}

Assistant:

void BTreeImpl::reserve(size_t size) {
  KJ_REQUIRE(size < (1u << 31), "b-tree has reached maximum size");

  // Calculate the worst-case number of leaves to cover the size, given that a leaf is always at
  // least half-full. (Note that it's correct for this calculation to round down, not up: The
  // remainder will necessarily be distributed among the non-full leaves, rather than creating a
  // new leaf, because if it went into a new leaf, that leaf would be less than half-full.)
  uint leaves = size / (Leaf::NROWS / 2);

  // Calculate the worst-case number of parents to cover the leaves, given that a parent is always
  // at least half-full. Since the parents form a tree with branching factor B, the size of the
  // tree is N/B + N/B^2 + N/B^3 + N/B^4 + ... = N / (B - 1). Math.
  constexpr uint branchingFactor = Parent::NCHILDREN / 2;
  uint parents = leaves / (branchingFactor - 1);

  // Height is log-base-branching-factor of leaves, plus 1 for the root node.
  uint height = lg(leaves | 1) / lg(branchingFactor) + 1;

  size_t newSize = leaves +
      parents + 1 +  // + 1 for the root
      height + 2;    // minimum freelist size needed by insert()

  if (treeCapacity < newSize) {
    growTree(newSize);
  }
}